

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O0

long __thiscall dlib::drawable::height(drawable *this)

{
  unsigned_long uVar1;
  auto_mutex *in_RDI;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffffc8;
  
  auto_mutex::auto_mutex(in_RDI,in_stack_ffffffffffffffc8);
  uVar1 = rectangle::height((rectangle *)in_stack_ffffffffffffffc8);
  auto_mutex::~auto_mutex((auto_mutex *)0x456e3e);
  return uVar1;
}

Assistant:

long height (
        ) const 
        { 
            auto_mutex M(m); 
            return rect.height(); 
        }